

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

void __thiscall wasm::OptimizeInstructions::canonicalize(OptimizeInstructions *this,Binary *binary)

{
  Id IVar1;
  Expression *this_00;
  bool bVar2;
  Id IVar3;
  BinaryOp BVar4;
  BinaryOp BVar5;
  int32_t iVar6;
  int64_t iVar7;
  Unary *pUVar8;
  Binary *pBVar9;
  LocalGet *pLVar10;
  Expression *pEVar11;
  bool bVar12;
  undefined1 local_68 [8];
  anon_class_16_2_3610dbfc swap;
  anon_class_24_3_4a829d37 maybeSwap;
  Binary *local_28;
  Binary *binary_local;
  
  local_28 = binary;
  bVar2 = shouldCanonicalize(this,binary);
  if (!bVar2) {
    __assert_fail("shouldCanonicalize(binary)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                  ,0xa97,"void wasm::OptimizeInstructions::canonicalize(Binary *)");
  }
  maybeSwap.binary = (Binary **)local_68;
  swap.this = (OptimizeInstructions *)&stack0xffffffffffffffd8;
  local_68 = (undefined1  [8])this;
  swap.binary = (Binary **)this;
  maybeSwap.this = swap.this;
  if ((binary->left->_id == ConstId) && (binary->right->_id != ConstId)) {
    canonicalize::anon_class_16_2_3610dbfc::operator()((anon_class_16_2_3610dbfc *)local_68);
    binary = local_28;
  }
  this_00 = binary->right;
  IVar3 = this_00->_id;
  if (IVar3 == ConstId) {
    BVar5 = binary->op;
    BVar4 = Abstract::getBinary((Type)(this_00->type).id,Sub);
    if (BVar5 == BVar4) {
      Literal::neg((Literal *)&maybeSwap.swap,(Literal *)(this_00 + 1));
      Literal::operator=((Literal *)(this_00 + 1),(Literal *)&maybeSwap.swap);
      Literal::~Literal((Literal *)&maybeSwap.swap);
      BVar5 = Abstract::getBinary((Type)(this_00->type).id,Add);
      local_28->op = BVar5;
      return;
    }
    BVar5 = local_28->op;
    BVar4 = Abstract::getBinary((Type)(this_00->type).id,GtS);
    if (BVar5 == BVar4) {
      iVar7 = Literal::getInteger((Literal *)(this_00 + 1));
      if (iVar7 == -1) {
        BVar5 = Abstract::getBinary((Type)(this_00->type).id,GeS);
        local_28->op = BVar5;
        Literal::makeZero((Literal *)&maybeSwap.swap,(Type)(this_00->type).id);
        Literal::operator=((Literal *)(this_00 + 1),(Literal *)&maybeSwap.swap);
        goto LAB_00ae0a70;
      }
    }
    BVar5 = local_28->op;
    BVar4 = Abstract::getBinary((Type)(this_00->type).id,LeS);
    if (BVar5 == BVar4) {
      iVar7 = Literal::getInteger((Literal *)(this_00 + 1));
      if (iVar7 == -1) {
        BVar5 = Abstract::getBinary((Type)(this_00->type).id,LtS);
        local_28->op = BVar5;
        Literal::makeZero((Literal *)&maybeSwap.swap,(Type)(this_00->type).id);
        Literal::operator=((Literal *)(this_00 + 1),(Literal *)&maybeSwap.swap);
        goto LAB_00ae0a70;
      }
    }
    BVar5 = local_28->op;
    BVar4 = Abstract::getBinary((Type)(this_00->type).id,LtS);
    if (BVar5 == BVar4) {
      iVar7 = Literal::getInteger((Literal *)(this_00 + 1));
      if (iVar7 == 1) {
        BVar5 = Abstract::getBinary((Type)(this_00->type).id,LeS);
        local_28->op = BVar5;
        Literal::makeZero((Literal *)&maybeSwap.swap,(Type)(this_00->type).id);
        Literal::operator=((Literal *)(this_00 + 1),(Literal *)&maybeSwap.swap);
        goto LAB_00ae0a70;
      }
    }
    BVar5 = local_28->op;
    BVar4 = Abstract::getBinary((Type)(this_00->type).id,GeS);
    if (BVar5 == BVar4) {
      iVar7 = Literal::getInteger((Literal *)(this_00 + 1));
      if (iVar7 == 1) {
        BVar5 = Abstract::getBinary((Type)(this_00->type).id,GtS);
        local_28->op = BVar5;
        Literal::makeZero((Literal *)&maybeSwap.swap,(Type)(this_00->type).id);
        Literal::operator=((Literal *)(this_00 + 1),(Literal *)&maybeSwap.swap);
        goto LAB_00ae0a70;
      }
    }
    BVar5 = local_28->op;
    BVar4 = Abstract::getBinary((Type)(this_00->type).id,LtU);
    if (BVar5 == BVar4) {
      iVar7 = Literal::getInteger((Literal *)(this_00 + 1));
      if (iVar7 == 1) {
        BVar5 = Abstract::getBinary((Type)(this_00->type).id,Eq);
        local_28->op = BVar5;
        Literal::makeZero((Literal *)&maybeSwap.swap,(Type)(this_00->type).id);
        Literal::operator=((Literal *)(this_00 + 1),(Literal *)&maybeSwap.swap);
        goto LAB_00ae0a70;
      }
    }
    BVar5 = local_28->op;
    BVar4 = Abstract::getBinary((Type)(this_00->type).id,GeU);
    if (BVar5 == BVar4) {
      iVar7 = Literal::getInteger((Literal *)(this_00 + 1));
      if (iVar7 == 1) {
        BVar5 = Abstract::getBinary((Type)(this_00->type).id,Ne);
        local_28->op = BVar5;
        Literal::makeZero((Literal *)&maybeSwap.swap,(Type)(this_00->type).id);
        Literal::operator=((Literal *)(this_00 + 1),(Literal *)&maybeSwap.swap);
        goto LAB_00ae0a70;
      }
    }
    BVar5 = local_28->op;
    if (BVar5 == LtSInt32) {
      iVar6 = Literal::geti32((Literal *)(this_00 + 1));
      if (iVar6 == -0x7fffffff) {
        local_28->op = EqInt32;
        Literal::makeSignedMin((Literal *)&maybeSwap.swap,(Type)0x2);
        Literal::operator=((Literal *)(this_00 + 1),(Literal *)&maybeSwap.swap);
        goto LAB_00ae0a70;
      }
      BVar5 = local_28->op;
    }
    if (BVar5 == LtSInt64) {
      iVar7 = Literal::geti64((Literal *)(this_00 + 1));
      if (iVar7 == -0x7fffffffffffffff) {
        local_28->op = EqInt64;
        Literal::makeSignedMin((Literal *)&maybeSwap.swap,(Type)0x3);
        Literal::operator=((Literal *)(this_00 + 1),(Literal *)&maybeSwap.swap);
        goto LAB_00ae0a70;
      }
      BVar5 = local_28->op;
    }
    if (BVar5 == GeSInt32) {
      iVar6 = Literal::geti32((Literal *)(this_00 + 1));
      if (iVar6 == -0x7fffffff) {
        local_28->op = NeInt32;
        Literal::makeSignedMin((Literal *)&maybeSwap.swap,(Type)0x2);
        Literal::operator=((Literal *)(this_00 + 1),(Literal *)&maybeSwap.swap);
        goto LAB_00ae0a70;
      }
      BVar5 = local_28->op;
    }
    if (BVar5 == GeSInt64) {
      iVar7 = Literal::geti64((Literal *)(this_00 + 1));
      if (iVar7 == -0x7fffffffffffffff) {
        local_28->op = NeInt64;
        Literal::makeSignedMin((Literal *)&maybeSwap.swap,(Type)0x3);
        Literal::operator=((Literal *)(this_00 + 1),(Literal *)&maybeSwap.swap);
        goto LAB_00ae0a70;
      }
      BVar5 = local_28->op;
    }
    if (BVar5 == GtSInt32) {
      iVar6 = Literal::geti32((Literal *)(this_00 + 1));
      if (iVar6 == 0x7ffffffe) {
        local_28->op = EqInt32;
        Literal::makeSignedMax((Literal *)&maybeSwap.swap,(Type)0x2);
        Literal::operator=((Literal *)(this_00 + 1),(Literal *)&maybeSwap.swap);
        goto LAB_00ae0a70;
      }
      BVar5 = local_28->op;
    }
    if (BVar5 == GtSInt64) {
      iVar7 = Literal::geti64((Literal *)(this_00 + 1));
      if (iVar7 == 0x7ffffffffffffffe) {
        local_28->op = EqInt64;
        Literal::makeSignedMax((Literal *)&maybeSwap.swap,(Type)0x3);
        Literal::operator=((Literal *)(this_00 + 1),(Literal *)&maybeSwap.swap);
        goto LAB_00ae0a70;
      }
      BVar5 = local_28->op;
    }
    if (BVar5 == LeSInt32) {
      iVar6 = Literal::geti32((Literal *)(this_00 + 1));
      if (iVar6 == 0x7ffffffe) {
        local_28->op = NeInt32;
        Literal::makeSignedMax((Literal *)&maybeSwap.swap,(Type)0x2);
        Literal::operator=((Literal *)(this_00 + 1),(Literal *)&maybeSwap.swap);
        goto LAB_00ae0a70;
      }
      BVar5 = local_28->op;
    }
    if (BVar5 == LeSInt64) {
      iVar7 = Literal::geti64((Literal *)(this_00 + 1));
      if (iVar7 == 0x7ffffffffffffffe) {
        local_28->op = NeInt64;
        Literal::makeSignedMax((Literal *)&maybeSwap.swap,(Type)0x3);
        Literal::operator=((Literal *)(this_00 + 1),(Literal *)&maybeSwap.swap);
        goto LAB_00ae0a70;
      }
      BVar5 = local_28->op;
    }
    BVar4 = Abstract::getBinary((Type)(this_00->type).id,LeU);
    if (BVar5 == BVar4) {
      iVar7 = Literal::getInteger((Literal *)(this_00 + 1));
      if (iVar7 == -2) {
        BVar5 = Abstract::getBinary((Type)(this_00->type).id,Ne);
        local_28->op = BVar5;
        Literal::makeUnsignedMax((Literal *)&maybeSwap.swap,(Type)(this_00->type).id);
        Literal::operator=((Literal *)(this_00 + 1),(Literal *)&maybeSwap.swap);
        goto LAB_00ae0a70;
      }
    }
    BVar5 = local_28->op;
    BVar4 = Abstract::getBinary((Type)(this_00->type).id,GtU);
    if (BVar5 != BVar4) {
      return;
    }
    iVar7 = Literal::getInteger((Literal *)(this_00 + 1));
    if (iVar7 != -2) {
      return;
    }
    BVar5 = Abstract::getBinary((Type)(this_00->type).id,Eq);
    local_28->op = BVar5;
    Literal::makeUnsignedMax((Literal *)&maybeSwap.swap,(Type)(this_00->type).id);
    Literal::operator=((Literal *)(this_00 + 1),(Literal *)&maybeSwap.swap);
LAB_00ae0a70:
    Literal::~Literal((Literal *)&maybeSwap.swap);
    return;
  }
  pEVar11 = binary->left;
  IVar1 = pEVar11->_id;
  if (IVar1 == LocalGetId) {
    if (IVar3 != LocalGetId) goto LAB_00ae05e4;
LAB_00ae05ce:
    pLVar10 = Expression::cast<wasm::LocalGet>(binary->right);
    bVar2 = *(uint *)(pEVar11 + 1) < pLVar10->index;
    bVar12 = *(uint *)(pEVar11 + 1) == pLVar10->index;
  }
  else {
    bVar2 = IVar1 < IVar3;
    bVar12 = IVar1 == IVar3;
    if (bVar12) {
      if (IVar3 == UnaryId) {
        pUVar8 = Expression::cast<wasm::Unary>(this_00);
        if ((int)pUVar8->op < *(int *)(pEVar11 + 1)) goto LAB_00ae05e4;
        pEVar11 = local_28->left;
        IVar3 = pEVar11->_id;
        binary = local_28;
      }
      if (IVar3 == BinaryId) {
        pBVar9 = Expression::cast<wasm::Binary>(binary->right);
        if ((int)pBVar9->op < *(int *)(pEVar11 + 1)) goto LAB_00ae05e4;
        pEVar11 = local_28->left;
        IVar3 = pEVar11->_id;
        binary = local_28;
      }
      if (IVar3 != LocalGetId) {
        return;
      }
      goto LAB_00ae05ce;
    }
  }
  if (bVar2 || bVar12) {
    return;
  }
LAB_00ae05e4:
  canonicalize::anon_class_24_3_4a829d37::operator()((anon_class_24_3_4a829d37 *)&swap.binary);
  return;
}

Assistant:

void canonicalize(Binary* binary) {
    assert(shouldCanonicalize(binary));
    auto swap = [&]() {
      assert(canReorder(binary->left, binary->right));
      if (binary->isRelational()) {
        binary->op = reverseRelationalOp(binary->op);
      }
      std::swap(binary->left, binary->right);
    };
    auto maybeSwap = [&]() {
      if (canReorder(binary->left, binary->right)) {
        swap();
      }
    };
    // Prefer a const on the right.
    if (binary->left->is<Const>() && !binary->right->is<Const>()) {
      swap();
    }
    if (auto* c = binary->right->dynCast<Const>()) {
      // x - C   ==>   x + (-C)
      // Prefer use addition if there is a constant on the right.
      if (binary->op == Abstract::getBinary(c->type, Abstract::Sub)) {
        c->value = c->value.neg();
        binary->op = Abstract::getBinary(c->type, Abstract::Add);
        return;
      }
      // Prefer to compare to 0 instead of to -1 or 1.
      // (signed)x > -1   ==>   x >= 0
      if (binary->op == Abstract::getBinary(c->type, Abstract::GtS) &&
          c->value.getInteger() == -1LL) {
        binary->op = Abstract::getBinary(c->type, Abstract::GeS);
        c->value = Literal::makeZero(c->type);
        return;
      }
      // (signed)x <= -1   ==>   x < 0
      if (binary->op == Abstract::getBinary(c->type, Abstract::LeS) &&
          c->value.getInteger() == -1LL) {
        binary->op = Abstract::getBinary(c->type, Abstract::LtS);
        c->value = Literal::makeZero(c->type);
        return;
      }
      // (signed)x < 1   ==>   x <= 0
      if (binary->op == Abstract::getBinary(c->type, Abstract::LtS) &&
          c->value.getInteger() == 1LL) {
        binary->op = Abstract::getBinary(c->type, Abstract::LeS);
        c->value = Literal::makeZero(c->type);
        return;
      }
      // (signed)x >= 1   ==>   x > 0
      if (binary->op == Abstract::getBinary(c->type, Abstract::GeS) &&
          c->value.getInteger() == 1LL) {
        binary->op = Abstract::getBinary(c->type, Abstract::GtS);
        c->value = Literal::makeZero(c->type);
        return;
      }
      // (unsigned)x < 1   ==>   x == 0
      if (binary->op == Abstract::getBinary(c->type, Abstract::LtU) &&
          c->value.getInteger() == 1LL) {
        binary->op = Abstract::getBinary(c->type, Abstract::Eq);
        c->value = Literal::makeZero(c->type);
        return;
      }
      // (unsigned)x >= 1   ==>   x != 0
      if (binary->op == Abstract::getBinary(c->type, Abstract::GeU) &&
          c->value.getInteger() == 1LL) {
        binary->op = Abstract::getBinary(c->type, Abstract::Ne);
        c->value = Literal::makeZero(c->type);
        return;
      }
      // Prefer compare to signed min (s_min) instead of s_min + 1.
      // (signed)x < s_min + 1   ==>   x == s_min
      if (binary->op == LtSInt32 && c->value.geti32() == INT32_MIN + 1) {
        binary->op = EqInt32;
        c->value = Literal::makeSignedMin(Type::i32);
        return;
      }
      if (binary->op == LtSInt64 && c->value.geti64() == INT64_MIN + 1) {
        binary->op = EqInt64;
        c->value = Literal::makeSignedMin(Type::i64);
        return;
      }
      // (signed)x >= s_min + 1   ==>   x != s_min
      if (binary->op == GeSInt32 && c->value.geti32() == INT32_MIN + 1) {
        binary->op = NeInt32;
        c->value = Literal::makeSignedMin(Type::i32);
        return;
      }
      if (binary->op == GeSInt64 && c->value.geti64() == INT64_MIN + 1) {
        binary->op = NeInt64;
        c->value = Literal::makeSignedMin(Type::i64);
        return;
      }
      // Prefer compare to signed max (s_max) instead of s_max - 1.
      // (signed)x > s_max - 1   ==>   x == s_max
      if (binary->op == GtSInt32 && c->value.geti32() == INT32_MAX - 1) {
        binary->op = EqInt32;
        c->value = Literal::makeSignedMax(Type::i32);
        return;
      }
      if (binary->op == GtSInt64 && c->value.geti64() == INT64_MAX - 1) {
        binary->op = EqInt64;
        c->value = Literal::makeSignedMax(Type::i64);
        return;
      }
      // (signed)x <= s_max - 1   ==>   x != s_max
      if (binary->op == LeSInt32 && c->value.geti32() == INT32_MAX - 1) {
        binary->op = NeInt32;
        c->value = Literal::makeSignedMax(Type::i32);
        return;
      }
      if (binary->op == LeSInt64 && c->value.geti64() == INT64_MAX - 1) {
        binary->op = NeInt64;
        c->value = Literal::makeSignedMax(Type::i64);
        return;
      }
      // Prefer compare to unsigned max (u_max) instead of u_max - 1.
      // (unsigned)x <= u_max - 1   ==>   x != u_max
      if (binary->op == Abstract::getBinary(c->type, Abstract::LeU) &&
          c->value.getInteger() == (int64_t)(UINT64_MAX - 1)) {
        binary->op = Abstract::getBinary(c->type, Abstract::Ne);
        c->value = Literal::makeUnsignedMax(c->type);
        return;
      }
      // (unsigned)x > u_max - 1   ==>   x == u_max
      if (binary->op == Abstract::getBinary(c->type, Abstract::GtU) &&
          c->value.getInteger() == (int64_t)(UINT64_MAX - 1)) {
        binary->op = Abstract::getBinary(c->type, Abstract::Eq);
        c->value = Literal::makeUnsignedMax(c->type);
        return;
      }
      return;
    }
    // Prefer a get on the right.
    if (binary->left->is<LocalGet>() && !binary->right->is<LocalGet>()) {
      return maybeSwap();
    }
    // Sort by the node id type, if different.
    if (binary->left->_id != binary->right->_id) {
      if (binary->left->_id > binary->right->_id) {
        return maybeSwap();
      }
      return;
    }
    // If the children have the same node id, we have to go deeper.
    if (auto* left = binary->left->dynCast<Unary>()) {
      auto* right = binary->right->cast<Unary>();
      if (left->op > right->op) {
        return maybeSwap();
      }
    }
    if (auto* left = binary->left->dynCast<Binary>()) {
      auto* right = binary->right->cast<Binary>();
      if (left->op > right->op) {
        return maybeSwap();
      }
    }
    if (auto* left = binary->left->dynCast<LocalGet>()) {
      auto* right = binary->right->cast<LocalGet>();
      if (left->index > right->index) {
        return maybeSwap();
      }
    }
  }